

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O2

void array_negation_test(void)

{
  array_container_t *src;
  bitset_container_t *dst;
  int x;
  int iVar1;
  ulong uVar2;
  bool bVar3;
  
  src = array_container_create();
  dst = bitset_container_create();
  for (iVar1 = 0; iVar1 != 0x10004; iVar1 = iVar1 + 0x1d) {
    array_container_add(src,(uint16_t)iVar1);
  }
  array_container_negation(src,dst);
  _assert_int_equal((long)dst->cardinality,0xf72c,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x56b);
  uVar2 = 0;
  while( true ) {
    if ((int)uVar2 == 0x10000) break;
    bVar3 = (ushort)((uint16_t)uVar2 % 0x1d) == 0;
    _assert_true((ulong)(((-(ulong)bVar3 ^ dst->words[uVar2 >> 6]) >> (uVar2 & 0x3f) & 1) != 0),
                 "bitset_container_contains(BO, (uint16_t)x)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                 ,(uint)!bVar3 * 2 + 0x56f);
    array_container_add(src,(uint16_t)uVar2);
    uVar2 = (ulong)((int)uVar2 + 1);
  }
  array_container_free(src);
  bitset_container_free(dst);
  return;
}

Assistant:

DEFINE_TEST(array_negation_test) {
    int ctr = 0;
    array_container_t* AI = array_container_create();
    bitset_container_t* BO = bitset_container_create();

    for (int x = 0; x < (1 << 16); x += 29) {
        array_container_add(AI, (uint16_t)x);
        ++ctr;
    }

    array_container_negation(AI, BO);
    assert_int_equal(bitset_container_cardinality(BO), (1 << 16) - ctr);

    for (int x = 0; x < (1 << 16); x++) {
        if (x % 29 == 0) {
            assert_false(bitset_container_contains(BO, (uint16_t)x));
        } else {
            assert_true(bitset_container_contains(BO, (uint16_t)x));
        }
        array_container_add(AI, (uint16_t)x);
        ++ctr;
    }

    array_container_free(AI);
    bitset_container_free(BO);
}